

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

c_int validate_settings(OSQPSettings *settings)

{
  c_int cVar1;
  double *in_RDI;
  
  if (in_RDI == (double *)0x0) {
    printf("ERROR in %s: ","validate_settings");
    printf("Missing settings!");
    printf("\n");
  }
  else if ((long)in_RDI[2] < 0) {
    printf("ERROR in %s: ","validate_settings");
    printf("scaling must be nonnegative");
    printf("\n");
  }
  else if ((in_RDI[3] == 0.0) || (in_RDI[3] == 4.94065645841247e-324)) {
    if ((long)in_RDI[4] < 0) {
      printf("ERROR in %s: ","validate_settings");
      printf("adaptive_rho_interval must be nonnegative");
      printf("\n");
    }
    else if (0.0 < in_RDI[6]) {
      if (1.0 < in_RDI[5] || in_RDI[5] == 1.0) {
        if ((long)in_RDI[0x10] < 0) {
          printf("ERROR in %s: ","validate_settings");
          printf("polish_refine_iter must be nonnegative");
          printf("\n");
        }
        else if (0.0 < *in_RDI) {
          if (0.0 < in_RDI[1]) {
            if (0.0 < in_RDI[0xe]) {
              if ((long)in_RDI[7] < 1) {
                printf("ERROR in %s: ","validate_settings");
                printf("max_iter must be positive");
                printf("\n");
              }
              else if (0.0 < in_RDI[8] || in_RDI[8] == 0.0) {
                if (0.0 < in_RDI[9] || in_RDI[9] == 0.0) {
                  if ((((in_RDI[9] == 0.0) && (!NAN(in_RDI[9]))) && (in_RDI[8] == 0.0)) &&
                     (!NAN(in_RDI[8]))) {
                    printf("ERROR in %s: ","validate_settings");
                    printf("at least one of eps_abs and eps_rel must be positive");
                    printf("\n");
                    return 1;
                  }
                  if (0.0 < in_RDI[10]) {
                    if (0.0 < in_RDI[0xb]) {
                      if ((0.0 < in_RDI[0xc]) && (in_RDI[0xc] < 2.0)) {
                        cVar1 = validate_linsys_solver((ulong)*(uint *)(in_RDI + 0xd));
                        if (cVar1 != 0) {
                          printf("ERROR in %s: ","validate_settings");
                          printf("linsys_solver not recognized");
                          printf("\n");
                          return 1;
                        }
                        if ((in_RDI[0x11] != 0.0) && (in_RDI[0x11] != 4.94065645841247e-324)) {
                          printf("ERROR in %s: ","validate_settings");
                          printf("verbose must be either 0 or 1");
                          printf("\n");
                          return 1;
                        }
                        if ((in_RDI[0x12] != 0.0) && (in_RDI[0x12] != 4.94065645841247e-324)) {
                          printf("ERROR in %s: ","validate_settings");
                          printf("scaled_termination must be either 0 or 1");
                          printf("\n");
                          return 1;
                        }
                        if ((long)in_RDI[0x13] < 0) {
                          printf("ERROR in %s: ","validate_settings");
                          printf("check_termination must be nonnegative");
                          printf("\n");
                          return 1;
                        }
                        if ((in_RDI[0x14] != 0.0) && (in_RDI[0x14] != 4.94065645841247e-324)) {
                          printf("ERROR in %s: ","validate_settings");
                          printf("warm_start must be either 0 or 1");
                          printf("\n");
                          return 1;
                        }
                        if (in_RDI[0x15] <= 0.0 && in_RDI[0x15] != 0.0) {
                          printf("ERROR in %s: ","validate_settings");
                          printf("time_limit must be nonnegative\n");
                          printf("\n");
                          return 1;
                        }
                        return 0;
                      }
                      printf("ERROR in %s: ","validate_settings");
                      printf("alpha must be strictly between 0 and 2");
                      printf("\n");
                    }
                    else {
                      printf("ERROR in %s: ","validate_settings");
                      printf("eps_dual_inf must be positive");
                      printf("\n");
                    }
                  }
                  else {
                    printf("ERROR in %s: ","validate_settings");
                    printf("eps_prim_inf must be positive");
                    printf("\n");
                  }
                }
                else {
                  printf("ERROR in %s: ","validate_settings");
                  printf("eps_rel must be nonnegative");
                  printf("\n");
                }
              }
              else {
                printf("ERROR in %s: ","validate_settings");
                printf("eps_abs must be nonnegative");
                printf("\n");
              }
            }
            else {
              printf("ERROR in %s: ","validate_settings");
              printf("delta must be positive");
              printf("\n");
            }
          }
          else {
            printf("ERROR in %s: ","validate_settings");
            printf("sigma must be positive");
            printf("\n");
          }
        }
        else {
          printf("ERROR in %s: ","validate_settings");
          printf("rho must be positive");
          printf("\n");
        }
      }
      else {
        printf("ERROR in %s: ","validate_settings");
        printf("adaptive_rho_tolerance must be >= 1");
        printf("\n");
      }
    }
    else {
      printf("ERROR in %s: ","validate_settings");
      printf("adaptive_rho_fraction must be positive");
      printf("\n");
    }
  }
  else {
    printf("ERROR in %s: ","validate_settings");
    printf("adaptive_rho must be either 0 or 1");
    printf("\n");
  }
  return 1;
}

Assistant:

c_int validate_settings(const OSQPSettings *settings) {
  if (!settings) {
# ifdef PRINTING
    c_eprint("Missing settings!");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->scaling < 0) {
# ifdef PRINTING
    c_eprint("scaling must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->adaptive_rho != 0) && (settings->adaptive_rho != 1)) {
# ifdef PRINTING
    c_eprint("adaptive_rho must be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->adaptive_rho_interval < 0) {
# ifdef PRINTING
    c_eprint("adaptive_rho_interval must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }
# ifdef PROFILING

  if (settings->adaptive_rho_fraction <= 0) {
#  ifdef PRINTING
    c_eprint("adaptive_rho_fraction must be positive");
#  endif /* ifdef PRINTING */
    return 1;
  }
# endif /* ifdef PROFILING */

  if (settings->adaptive_rho_tolerance < 1.0) {
# ifdef PRINTING
    c_eprint("adaptive_rho_tolerance must be >= 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->polish_refine_iter < 0) {
# ifdef PRINTING
    c_eprint("polish_refine_iter must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->rho <= 0.0) {
# ifdef PRINTING
    c_eprint("rho must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->sigma <= 0.0) {
# ifdef PRINTING
    c_eprint("sigma must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->delta <= 0.0) {
# ifdef PRINTING
    c_eprint("delta must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->max_iter <= 0) {
# ifdef PRINTING
    c_eprint("max_iter must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->eps_abs < 0.0) {
# ifdef PRINTING
    c_eprint("eps_abs must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->eps_rel < 0.0) {
# ifdef PRINTING
    c_eprint("eps_rel must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->eps_rel == 0.0) &&
      (settings->eps_abs == 0.0)) {
# ifdef PRINTING
    c_eprint("at least one of eps_abs and eps_rel must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->eps_prim_inf <= 0.0) {
# ifdef PRINTING
    c_eprint("eps_prim_inf must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->eps_dual_inf <= 0.0) {
# ifdef PRINTING
    c_eprint("eps_dual_inf must be positive");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->alpha <= 0.0) ||
      (settings->alpha >= 2.0)) {
# ifdef PRINTING
    c_eprint("alpha must be strictly between 0 and 2");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (validate_linsys_solver(settings->linsys_solver)) {
# ifdef PRINTING
    c_eprint("linsys_solver not recognized");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->verbose != 0) &&
      (settings->verbose != 1)) {
# ifdef PRINTING
    c_eprint("verbose must be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->scaled_termination != 0) &&
      (settings->scaled_termination != 1)) {
# ifdef PRINTING
    c_eprint("scaled_termination must be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  if (settings->check_termination < 0) {
# ifdef PRINTING
    c_eprint("check_termination must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  if ((settings->warm_start != 0) &&
      (settings->warm_start != 1)) {
# ifdef PRINTING
    c_eprint("warm_start must be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }
# ifdef PROFILING

  if (settings->time_limit < 0.0) {
#  ifdef PRINTING
    c_eprint("time_limit must be nonnegative\n");
#  endif /* ifdef PRINTING */
    return 1;
  }
# endif /* ifdef PROFILING */

  return 0;
}